

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O2

char * private_RemoveWhiteSpace<true>(json_string *value_t,bool escapeQuotes,size_t *len)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  json_string *msg;
  byte bVar4;
  byte *pbVar5;
  byte *end;
  allocator local_61;
  byte *local_60;
  byte *local_58;
  json_string local_50;
  
  pbVar3 = (byte *)json_malloc<char>(value_t->_M_string_length + 1);
  local_60 = pbVar3;
  msg = jsonSingletonERROR_OUT_OF_MEMORY::getValue_abi_cxx11_();
  JSONDebug::_JSON_ASSERT(pbVar3 != (byte *)0x0,msg);
  local_58 = (byte *)(value_t->_M_dataplus)._M_p;
  end = local_58 + value_t->_M_string_length;
  do {
    if (local_58 == end) {
LAB_00113f99:
      *len = (long)local_60 - (long)pbVar3;
      return (char *)pbVar3;
    }
    bVar4 = *local_58;
    if (((1 < bVar4 - 9) && (bVar4 != 0xd)) && (bVar4 != 0x20)) {
      if (bVar4 == 0x22) {
        *local_60 = 0x22;
        local_60 = local_60 + 1;
        while( true ) {
          pbVar1 = local_58 + 1;
          bVar4 = local_58[1];
          if (bVar4 == 0x22) break;
          if (pbVar1 == end) goto LAB_00113f99;
          pbVar5 = local_60;
          pbVar2 = local_60 + 1;
          if (bVar4 == 0x5c) {
            *local_60 = 0x5c;
            bVar4 = local_58[2];
            if ((escapeQuotes) && (bVar4 == 0x22)) {
              used_ascii_one = true;
              bVar4 = 1;
            }
            pbVar5 = local_60 + 1;
            pbVar2 = local_60 + 2;
            pbVar1 = local_58 + 2;
          }
          local_58 = pbVar1;
          local_60 = pbVar2;
          *pbVar5 = bVar4;
        }
        bVar4 = 0x22;
        local_58 = pbVar1;
LAB_00113f44:
        *local_60 = bVar4;
        local_60 = local_60 + 1;
      }
      else {
        if (bVar4 != 0x23) {
          if (bVar4 == 0x2f) {
            pbVar1 = local_58 + 1;
            pbVar5 = local_58 + 1;
            local_58 = pbVar1;
            if (*pbVar5 == 0x2a) {
              *local_60 = 0x23;
              local_60 = local_60 + 1;
              while( true ) {
                if ((local_58[1] == 0x2a) && (local_58[2] == 0x2f)) break;
                if (local_58 + 1 == end) {
                  *local_60 = 0x23;
                  local_60 = local_60 + 1;
                  goto LAB_00113f99;
                }
                *local_60 = local_58[1];
                local_60 = local_60 + 1;
                local_58 = local_58 + 1;
              }
              local_58 = local_58 + 2;
              *local_60 = 0x23;
              local_60 = local_60 + 1;
              goto LAB_00113f6d;
            }
            if (*pbVar5 == 0x2f) goto LAB_00113f5f;
            std::__cxx11::string::string
                      ((string *)&local_50,"stray / character, not quoted, or a comment",&local_61);
          }
          else if (bVar4 < 0x20) {
            std::__cxx11::string::string
                      ((string *)&local_50,"Invalid JSON character detected (lo)",&local_61);
          }
          else {
            if (bVar4 < 0x7f) goto LAB_00113f44;
            std::__cxx11::string::string
                      ((string *)&local_50,"Invalid JSON character detected (hi)",&local_61);
          }
          JSONDebug::_JSON_FAIL(&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          goto LAB_00113f99;
        }
LAB_00113f5f:
        SingleLineComment((char **)&local_58,(char *)end,(char **)&local_60);
      }
    }
LAB_00113f6d:
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

json_char * private_RemoveWhiteSpace(const json_string & value_t, bool escapeQuotes, size_t & len) json_nothrow {
#endif
	json_char * result;
	json_char * runner = result = json_malloc<json_char>(value_t.length() + 1);  //dealing with raw memory is faster than adding to a json_string
	JSON_ASSERT(result != 0, json_global(ERROR_OUT_OF_MEMORY));
	const json_char * const end = value_t.data() + value_t.length();
	for(const json_char * p = value_t.data(); p != end; ++p){
	  switch(*p){
		 case JSON_TEXT(' '):   //defined as white space
		 case JSON_TEXT('\t'):  //defined as white space
		 case JSON_TEXT('\n'):  //defined as white space
		 case JSON_TEXT('\r'):  //defined as white space
			break;
		#ifndef JSON_STRICT
			case JSON_TEXT('/'):  //a C comment
				if (*(++p) == JSON_TEXT('*')){  //a multiline comment
				   if (T) COMMENT_DELIMITER();
				   while ((*(++p) != JSON_TEXT('*')) || (*(p + 1) != JSON_TEXT('/'))){
					  if(p == end){
							COMMENT_DELIMITER(); 
							goto endofrunner;
						}
					  if (T) *runner++ = *p;
				   }
				   ++p;
				   if (T) COMMENT_DELIMITER();
				   break;
				}
				//Should be a single line C comment, so let it fall through to use the bash comment stripper
				JSON_ASSERT_SAFE(*p == JSON_TEXT('/'), JSON_TEXT("stray / character, not quoted, or a comment"), goto endofrunner;);
			case JSON_TEXT('#'):  //a bash comment
				if (T){
					SingleLineComment(p, end AND_RUNNER);
				} else {
					SingleLineComment(p, end);
				}
				break;
		 #endif
		 case JSON_TEXT('\"'):  //a quote
			*runner++ = JSON_TEXT('\"');
			while(*(++p) != JSON_TEXT('\"')){  //find the end of the quotation, as white space is preserved within it
				if(p == end) goto endofrunner;
				switch(*p){
				   case JSON_TEXT('\\'):
					  *runner++ = JSON_TEXT('\\');
					  if (escapeQuotes){
							*runner++ = (*++p == JSON_TEXT('\"')) ? ascii_one() : *p;  //an escaped quote will reak havoc will all of my searching functions, so change it into an illegal character in JSON for convertion later on
					  } else {
							*runner++ = *++p;
					  }
					  break;
				   default:
					  *runner++ = *p;
					  break;
				}
			}
			//no break, let it fall through so that the trailing quote gets added
		 default:
			JSON_ASSERT_SAFE((json_uchar)*p >= 32, JSON_TEXT("Invalid JSON character detected (lo)"), goto endofrunner;);
			JSON_ASSERT_SAFE((json_uchar)*p <= 126, JSON_TEXT("Invalid JSON character detected (hi)"), goto endofrunner;);
			*runner++ = *p;
			break;
	  }
	}
	endofrunner:
	len = runner - result;
	return result;
}